

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_swp.cpp
# Opt level: O3

UBool ucol_looksLikeCollationBinary_63(UDataSwapper *ds,void *inData,int32_t length)

{
  int32_t iVar1;
  uint32_t uVar2;
  undefined8 in_RAX;
  UErrorCode errorCode;
  undefined8 uStack_28;
  
  if (length < -1 || (inData == (void *)0x0 || ds == (UDataSwapper *)0x0)) {
    return '\0';
  }
  uStack_28 = CONCAT71((int7)((ulong)in_RAX >> 8),
                       length < -1 || (inData == (void *)0x0 || ds == (UDataSwapper *)0x0)) &
              0xffffffff;
  udata_swapDataHeader_63(ds,inData,-1,(void *)0x0,(UErrorCode *)((long)&uStack_28 + 4));
  if ((((uStack_28._4_4_ < 1) && (*(char *)((long)inData + 0xc) == 'U')) &&
      (*(char *)((long)inData + 0xd) == 'C')) &&
     ((*(char *)((long)inData + 0xe) == 'o' && (*(char *)((long)inData + 0xf) == 'l')))) {
    return '\x01';
  }
  if (length < 0) {
    udata_readInt32_63(ds,*inData);
  }
  else {
    if ((uint)length < 0xa8) {
      return '\0';
    }
    iVar1 = udata_readInt32_63(ds,*inData);
    if (length < iVar1) {
      return '\0';
    }
  }
  uVar2 = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x10));
  if (((uVar2 == 0x20030618) && (*(char *)((long)inData + 0x50) == '\x03')) &&
     (*(char *)((long)inData + 0x41) == ds->inIsBigEndian)) {
    return *(uint8_t *)((long)inData + 0x42) == ds->inCharset;
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2
ucol_looksLikeCollationBinary(const UDataSwapper *ds,
                              const void *inData, int32_t length) {
    if(ds==NULL || inData==NULL || length<-1) {
        return FALSE;
    }

    // First check for format version 4+ which has a standard data header.
    UErrorCode errorCode=U_ZERO_ERROR;
    (void)udata_swapDataHeader(ds, inData, -1, NULL, &errorCode);
    if(U_SUCCESS(errorCode)) {
        const UDataInfo &info=*(const UDataInfo *)((const char *)inData+4);
        if(info.dataFormat[0]==0x55 &&   // dataFormat="UCol"
                info.dataFormat[1]==0x43 &&
                info.dataFormat[2]==0x6f &&
                info.dataFormat[3]==0x6c) {
            return TRUE;
        }
    }

    // Else check for format version 3.
    const UCATableHeader *inHeader=(const UCATableHeader *)inData;

    /*
     * The collation binary must contain at least the UCATableHeader,
     * starting with its size field.
     * sizeof(UCATableHeader)==42*4 in ICU 2.8
     * check the length against the header size before reading the size field
     */
    UCATableHeader header;
    uprv_memset(&header, 0, sizeof(header));
    if(length<0) {
        header.size=udata_readInt32(ds, inHeader->size);
    } else if((length<(42*4) || length<(header.size=udata_readInt32(ds, inHeader->size)))) {
        return FALSE;
    }

    header.magic=ds->readUInt32(inHeader->magic);
    if(!(
        header.magic==UCOL_HEADER_MAGIC &&
        inHeader->formatVersion[0]==3 /*&&
        inHeader->formatVersion[1]>=0*/
    )) {
        return FALSE;
    }

    if(inHeader->isBigEndian!=ds->inIsBigEndian || inHeader->charSetFamily!=ds->inCharset) {
        return FALSE;
    }

    return TRUE;
}